

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

void __thiscall Gluco::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *cr;
  int iVar4;
  long lVar5;
  long lVar6;
  vec<unsigned_int> *pvVar7;
  long lVar8;
  
  if (this->use_simplification == true) {
    if (0 < (this->super_Solver).vardata.sz) {
      lVar6 = 0;
      do {
        pvVar7 = (this->occurs).occs.data;
        if (0 < pvVar7[lVar6].sz) {
          pvVar7 = pvVar7 + lVar6;
          lVar5 = 0;
          lVar8 = 0;
          do {
            ClauseAllocator::reloc(&(this->super_Solver).ca,(CRef *)((long)pvVar7->data + lVar5),to)
            ;
            lVar8 = lVar8 + 1;
            lVar5 = lVar5 + 4;
          } while (lVar8 < pvVar7->sz);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->super_Solver).vardata.sz);
    }
    iVar3 = (this->subsumption_queue).end;
    iVar4 = 0;
    iVar1 = (this->subsumption_queue).first;
    iVar2 = iVar3 - iVar1;
    if (iVar3 < iVar1) {
      iVar4 = (this->subsumption_queue).buf.sz;
    }
    iVar3 = iVar2 + iVar4;
    if (iVar3 != 0 && SCARRY4(iVar2,iVar4) == iVar3 < 0) {
      iVar3 = 0;
      do {
        cr = Queue<unsigned_int>::operator[](&this->subsumption_queue,iVar3);
        ClauseAllocator::reloc(&(this->super_Solver).ca,cr,to);
        iVar1 = (this->subsumption_queue).end;
        iVar2 = 0;
        iVar4 = (this->subsumption_queue).first;
        if (iVar1 < iVar4) {
          iVar2 = (this->subsumption_queue).buf.sz;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (iVar1 - iVar4) + iVar2);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,to);
    return;
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    int i;
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}